

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

anytype_t * anytype_from_float(anytype_t *val,int t,double f)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int len;
  double f_local;
  int t_local;
  anytype_t *val_local;
  
  if (val == (anytype_t *)0x0) {
    val_local = (anytype_t *)0x0;
  }
  else {
    val_local = val;
    switch(t) {
    case 2:
    case 3:
      val->i = (long)f;
      break;
    case 4:
    case 5:
      val->fl = f;
      break;
    default:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
              ,0x328,"Unknown argument type: %d\n",(ulong)(uint)t);
      val_local = (anytype_t *)0x0;
      break;
    case 8:
    case 9:
      iVar1 = snprintf((char *)0x0,0,"%g",f);
      if (iVar1 < 0) {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                       ,0x31d,"snprintf() failed");
        val_local = (anytype_t *)0x0;
      }
      else {
        pvVar3 = __ckd_malloc__((long)(iVar1 + 1),
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                ,800);
        val->ptr = pvVar3;
        iVar2 = snprintf((char *)val->ptr,(long)(iVar1 + 1),"%g",f);
        if (iVar2 != iVar1) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                         ,0x322,"snprintf() failed");
          val_local = (anytype_t *)0x0;
        }
      }
      break;
    case 0x10:
    case 0x11:
      *val = (anytype_t)(long)(int)(uint)(f != 0.0);
    }
  }
  return val_local;
}

Assistant:

anytype_t *
anytype_from_float(anytype_t *val, int t, double f)
{
    if (val == NULL)
        return NULL;
    switch (t) {
    case ARG_INTEGER:
    case REQARG_INTEGER:
        val->i = (long)f;
        break;
    case ARG_FLOATING:
    case REQARG_FLOATING:
        val->fl = f;
        break;
    case ARG_BOOLEAN:
    case REQARG_BOOLEAN:
        val->i = (f != 0.0);
        break;
    case ARG_STRING:
    case REQARG_STRING: {
        int len = snprintf(NULL, 0, "%g", f);
        if (len < 0) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        val->ptr = ckd_malloc(len + 1);
        if (snprintf(val->ptr, len + 1, "%g", f) != len) {
            E_ERROR_SYSTEM("snprintf() failed");
            return NULL;
        }
        break;
    }
    default:
        E_ERROR("Unknown argument type: %d\n", t);
        return NULL;
    }
    return val;
}